

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O0

Result __thiscall
wabt::interp::Func::Call
          (Func *this,Store *store,Values *params,Values *results,Ptr *out_trap,Stream *trace_stream
          )

{
  Enum EVar1;
  Thread *pTVar2;
  undefined1 local_68 [8];
  Ptr thread;
  Options options;
  Stream *trace_stream_local;
  Ptr *out_trap_local;
  Values *results_local;
  Values *params_local;
  Store *store_local;
  Func *this_local;
  
  Thread::Options::Options((Options *)&thread.root_index_);
  Thread::New((Ptr *)local_68,store,(Options *)&thread.root_index_);
  pTVar2 = RefPtr<wabt::interp::Thread>::operator*((RefPtr<wabt::interp::Thread> *)local_68);
  EVar1 = (*(this->super_Extern).super_Object._vptr_Object[5])(this,pTVar2,params,results,out_trap);
  RefPtr<wabt::interp::Thread>::~RefPtr((RefPtr<wabt::interp::Thread> *)local_68);
  return (Result)EVar1;
}

Assistant:

Result Func::Call(Store& store,
                  const Values& params,
                  Values& results,
                  Trap::Ptr* out_trap,
                  Stream* trace_stream) {
  Thread::Options options;
  options.trace_stream = trace_stream;
  Thread::Ptr thread = Thread::New(store, options);
  return DoCall(*thread, params, results, out_trap);
}